

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

int __thiscall helics::FederateState::checkInterfaces(FederateState *this)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  int iVar3;
  undefined8 uVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  pointer ppVar6;
  string_view fmt;
  string_view logMessageSource;
  string_view fmt_00;
  string_view logMessageSource_00;
  format_args args;
  string_view message;
  format_args args_00;
  string_view message_00;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  issues;
  string local_88;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_68;
  size_t sStack_60;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_58;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  InterfaceInfo::checkInterfacesForIssues_abi_cxx11_(&local_48,&this->interfaceInformation);
  if (local_48.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_48.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar3 = 0;
  }
  else {
    this->errorCode =
         (local_48.
          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->first;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &this->errorString,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(local_48.
                 super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second);
    if (local_48.
        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppVar6 = local_48.
               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        sVar2 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
        _Var1._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
        if (ppVar6->first == -2) {
          local_68 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                     (ppVar6->second)._M_dataplus._M_p;
          sStack_60 = (ppVar6->second)._M_string_length;
          fmt.size_ = 0xd;
          fmt.data_ = (char *)0x14;
          args.field_1.values_ = in_R9.values_;
          args.desc_ = (unsigned_long_long)&local_68;
          ::fmt::v11::vformat_abi_cxx11_(&local_88,(v11 *)"Connection Error: {}",fmt,args);
          in_R9._4_4_ = local_88._M_dataplus._M_p._4_4_;
          in_R9._0_4_ = (int)local_88._M_dataplus._M_p;
          logMessageSource._M_str = _Var1._M_p;
          logMessageSource._M_len = sVar2;
          message._M_str = (char *)in_R9.values_;
          message._M_len = local_88._M_string_length;
          logMessage(this,0,logMessageSource,message,false);
          aVar5._4_4_ = local_88._M_dataplus._M_p._4_4_;
          aVar5._0_4_ = (int)local_88._M_dataplus._M_p;
          uVar4 = local_88.field_2._M_allocated_capacity;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)aVar5.values_ != &local_88.field_2) {
LAB_0030d226:
            operator_delete(aVar5.values_,(ulong)((long)&((named_arg_info<char> *)uVar4)->name + 1))
            ;
          }
        }
        else {
          local_88.field_2._M_allocated_capacity = (size_type)(ppVar6->second)._M_dataplus._M_p;
          local_88.field_2._8_8_ = (ppVar6->second)._M_string_length;
          fmt_00.size_ = 0xd1;
          fmt_00.data_ = (char *)0x11;
          args_00.field_1.values_ = in_R9.values_;
          args_00.desc_ = (unsigned_long_long)&local_88;
          local_88._M_dataplus._M_p._0_4_ = ppVar6->first;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&local_68,(v11 *)"error code {}: {}",fmt_00,args_00);
          logMessageSource_00._M_str = _Var1._M_p;
          logMessageSource_00._M_len = sVar2;
          message_00._M_str = (char *)local_68.values_;
          message_00._M_len = sStack_60;
          in_R9 = local_68;
          logMessage(this,0,logMessageSource_00,message_00,false);
          uVar4 = local_58.long_long_value;
          aVar5 = local_68;
          if (&(local_68.values_)->field_0 != &local_58) goto LAB_0030d226;
        }
        ppVar6 = ppVar6 + 1;
      } while (ppVar6 != local_48.
                         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    iVar3 = this->errorCode;
  }
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_48);
  return iVar3;
}

Assistant:

int FederateState::checkInterfaces()
{
    auto issues = interfaceInformation.checkInterfacesForIssues();
    if (issues.empty()) {
        return 0;
    }
    errorCode = issues.front().first;
    errorString = issues.front().second;
    for (auto& issue : issues) {
        switch (issue.first) {
            case defs::Errors::CONNECTION_FAILURE:
                LOG_ERROR(fmt::format("Connection Error: {}", issue.second));
                break;
            default:
                LOG_ERROR(fmt::format("error code {}: {}", issue.first, issue.second));
                break;
        }
    }
    return errorCode;
}